

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsLinkable(cmGeneratorTarget *this)

{
  TargetType TVar1;
  undefined1 local_11;
  cmGeneratorTarget *this_local;
  
  TVar1 = GetType(this);
  local_11 = true;
  if (TVar1 != STATIC_LIBRARY) {
    TVar1 = GetType(this);
    local_11 = true;
    if (TVar1 != SHARED_LIBRARY) {
      TVar1 = GetType(this);
      local_11 = true;
      if (TVar1 != MODULE_LIBRARY) {
        TVar1 = GetType(this);
        local_11 = true;
        if (TVar1 != UNKNOWN_LIBRARY) {
          TVar1 = GetType(this);
          local_11 = true;
          if (TVar1 != OBJECT_LIBRARY) {
            TVar1 = GetType(this);
            local_11 = true;
            if (TVar1 != INTERFACE_LIBRARY) {
              local_11 = IsExecutableWithExports(this);
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool cmGeneratorTarget::IsLinkable() const
{
  return (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
          this->GetType() == cmStateEnums::SHARED_LIBRARY ||
          this->GetType() == cmStateEnums::MODULE_LIBRARY ||
          this->GetType() == cmStateEnums::UNKNOWN_LIBRARY ||
          this->GetType() == cmStateEnums::OBJECT_LIBRARY ||
          this->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
          this->IsExecutableWithExports());
}